

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# adiosCommMPI.cpp
# Opt level: O0

int __thiscall adios2::helper::CommImplMPI::Win_unlock_all(CommImplMPI *this,Win *win,string *hint)

{
  int iVar1;
  long lVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__lhs;
  Win *in_RSI;
  int ret;
  CommWinImplMPI *w;
  string *in_stack_000000c8;
  int in_stack_000000d4;
  string *__rhs;
  string local_68 [24];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffffb0;
  char *in_stack_ffffffffffffffb8;
  
  lVar2 = adios2::helper::CommWinImpl::Get(in_RSI);
  if (lVar2 == 0) {
    __lhs = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  }
  else {
    __lhs = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
            __dynamic_cast(lVar2,&CommWinImpl::typeinfo,&CommWinImplMPI::typeinfo,0);
  }
  iVar1 = MPI_Win_unlock_all(__lhs->_M_string_length);
  __rhs = local_68;
  std::operator+(in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb0);
  std::operator+(__lhs,(char *)__rhs);
  anon_unknown_1::CheckMPIReturn(in_stack_000000d4,in_stack_000000c8);
  std::__cxx11::string::~string((string *)&stack0xffffffffffffffb8);
  std::__cxx11::string::~string(local_68);
  return iVar1;
}

Assistant:

int CommImplMPI::Win_unlock_all(Comm::Win &win, const std::string &hint) const
{
    CommWinImplMPI *w = dynamic_cast<CommWinImplMPI *>(CommWinImpl::Get(win));
    int ret = MPI_Win_unlock_all(w->m_Win);
    CheckMPIReturn(ret, "in call to Win_Lock " + hint + "\n");
    return ret;
}